

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthBasePort.cpp
# Opt level: O3

bool EthBasePort::checkCRC(uchar *packet)

{
  return true;
}

Assistant:

bool EthBasePort::checkCRC(const unsigned char *packet)
{
    // Eliminate CRC checking of FireWire packets received via Ethernet
    // because Ethernet already includes CRC.
#if 0
    // Note that FW_QREPONSE_SIZE == FW_BRESPONSE_HEADER_SIZE
    uint32_t crc_check = BitReverse32(crc32(0U, packet, FW_QRESPONSE_SIZE-FW_CRC_SIZE));
    uint32_t crc_original = bswap_32(*reinterpret_cast<const uint32_t *>(packet+FW_QRESPONSE_SIZE-FW_CRC_SIZE));
    return (crc_check == crc_original);
#else
    return true;
#endif
}